

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

void __thiscall
pbrt::GoniometricLight::PDF_Le(GoniometricLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  float *in_RCX;
  undefined4 *in_RDX;
  Vector3f *in_RDI;
  Float FVar1;
  Float FVar2;
  double dVar3;
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  float fVar7;
  Vector3<float> VVar8;
  Float phi;
  Float theta;
  Vector3f wl;
  Vector3<float> *in_stack_00000088;
  Transform *in_stack_00000090;
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Point2f *pr;
  undefined4 in_stack_ffffffffffffffb4;
  
  auVar6 = in_ZMM0._8_56_;
  *in_RDX = 0;
  VVar8 = Transform::ApplyInverse<float>(in_stack_00000090,in_stack_00000088);
  auVar4._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar6;
  vmovlpd_avx(auVar4._0_16_);
  VVar8 = Normalize<float>((Vector3<float> *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  fVar7 = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar5._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar6;
  pr = (Point2f *)vmovlpd_avx(auVar5._0_16_);
  FVar1 = SphericalTheta((Vector3f *)0x6ef048);
  SphericalPhi(in_RDI);
  Point2<float>::Point2((Point2<float> *)in_RDI,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
  ;
  FVar2 = PiecewiseConstant2D::PDF
                    ((PiecewiseConstant2D *)CONCAT44(in_stack_ffffffffffffffb4,fVar7),pr);
  dVar3 = std::sin((double)(ulong)(uint)FVar1);
  *in_RCX = FVar2 / SUB84(dVar3,0);
  return;
}

Assistant:

void GoniometricLight::PDF_Le(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    *pdfPos = 0.f;

    Vector3f wl = Normalize(renderFromLight.ApplyInverse(ray.d));
    Float theta = SphericalTheta(wl), phi = SphericalPhi(wl);
    *pdfDir = distrib.PDF(Point2f(phi, theta)) / std::sin(theta);
}